

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# battlewithlandlord.cc
# Opt level: O3

void __thiscall
BattleWithLandlord::AlphaBetaDFS
          (BattleWithLandlord *this,BattleWithLandlord *bld,int *score,bool *res)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  int depth;
  BattleWithLandlord *this_00;
  
  bld->_max_depth = 0x80;
  depth = 0x80;
  iVar2 = AlphaBeta(bld,0x80,-30000,30000,&bld->_pv);
  *score = iVar2;
  if (iVar2 - 0x7149U < 0xffff1d6f) {
    uVar3 = pthread_mutex_lock((pthread_mutex_t *)&this->_mtx);
    if (uVar3 != 0) {
      this_00 = (BattleWithLandlord *)(ulong)uVar3;
      std::__throw_system_error(uVar3);
      if (depth < 1) {
        depth = 0x80;
      }
      this_00->_max_depth = depth;
      AlphaBeta(this_00,depth,-30000,30000,&this_00->_pv);
      return;
    }
    this->_stopsearch = true;
    pthread_mutex_unlock((pthread_mutex_t *)&this->_mtx);
    bVar1 = true;
  }
  else {
    bVar1 = false;
  }
  *res = bVar1;
  return;
}

Assistant:

void BattleWithLandlord::AlphaBetaDFS(BattleWithLandlord *bld, int &score, bool &res) {

    score = bld->GetBestMove(128);
    if (score > WIN_SCORE || score < -WIN_SCORE) {
        {
            std::lock_guard<std::mutex> lck(_mtx);
            _stopsearch = true;
        }
        res = true;
    } else {
        res = false;
    }
}